

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O3

void Extra_PrintBinary__(FILE *pFile,uint *Sign,int nBits)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar1 = nBits & 0x1f;
  iVar3 = (uint)(uVar1 != 0) + (int)((ulong)(long)nBits >> 5);
  if (0 < iVar3) {
    uVar4 = (ulong)(iVar3 - 1);
    uVar2 = uVar4;
    do {
      uVar5 = 0x1f;
      if (uVar2 == uVar4) {
        uVar5 = uVar1 - 1;
      }
      if (uVar1 == 0) {
        uVar5 = 0x1f;
      }
      if (-1 < (int)uVar5) {
        do {
          fputc(((Sign[uVar2] >> (uVar5 & 0x1f) & 1) != 0) + 0x30,(FILE *)pFile);
          bVar6 = uVar5 != 0;
          uVar5 = uVar5 - 1;
        } while (bVar6);
      }
      iVar3 = (int)uVar2;
      uVar2 = uVar2 - 1;
    } while (0 < iVar3);
  }
  return;
}

Assistant:

void Extra_PrintBinary__( FILE * pFile, unsigned Sign[], int nBits )
{
    int Remainder, nWords;
    int w, i;

    Remainder = (nBits%(sizeof(unsigned)*8));
    nWords    = (nBits/(sizeof(unsigned)*8)) + (Remainder>0);

    for ( w = nWords-1; w >= 0; w-- )
        for ( i = ((w == nWords-1 && Remainder)? Remainder-1: 31); i >= 0; i-- )
            fprintf( pFile, "%c", '0' + (int)((Sign[w] & (1<<i)) > 0) );
}